

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O3

double __thiscall Calculator::value(Calculator *this,Token *t)

{
  uint uVar1;
  double def;
  double local_10;
  
  local_10 = 0.0;
  if (t->type == NAME) {
    uVar1 = asl::Map<asl::String,_double>::indexOf
                      (&(this->_variables).super_Map<asl::String,_double>,&t->val);
    t = (Token *)&stack0xfffffffffffffff0;
    if (-1 < (int)uVar1) {
      t = (Token *)&(this->_variables).super_Map<asl::String,_double>.a._a[uVar1].value;
    }
  }
  return t->x;
}

Assistant:

double Calculator::value(const Calculator::Token& t) const
{
	double def = 0.0;
	return (t.type == NAME)? _variables.get(t.val, def) : t.x;
}